

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::toCurrencyString(QLocale *this,qulonglong value,QString *symbol)

{
  bool bVar1;
  undefined1 uVar2;
  QLocalePrivate *pQVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *res;
  QString sym;
  QString str;
  CurrencyToStringArgument arg;
  QVariant *in_stack_fffffffffffffe58;
  CurrencyToStringArgument *in_stack_fffffffffffffe60;
  CurrencyToStringArgument *in_stack_fffffffffffffe68;
  CurrencyToStringArgument *in_stack_fffffffffffffe70;
  char16_t *table;
  undefined7 in_stack_fffffffffffffe78;
  QSystemLocale *in_stack_fffffffffffffe80;
  QString *in_stack_fffffffffffffe88;
  CurrencySymbolFormat in_stack_fffffffffffffeac;
  uint uVar4;
  uint in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  QString local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4da39f);
  if (pQVar3->m_data == &systemLocaleData) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    in_stack_fffffffffffffe88 = &local_68;
    ::QVariant::QVariant(&in_stack_fffffffffffffe60->value,(qulonglong)in_stack_fffffffffffffe68);
    QSystemLocale::CurrencyToStringArgument::CurrencyToStringArgument
              (in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->value,
               (QString *)in_stack_fffffffffffffe60);
    ::QVariant::~QVariant(&in_stack_fffffffffffffe60->value);
    in_stack_fffffffffffffeb0 = in_stack_fffffffffffffeb0 & 0xffffff;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    in_stack_fffffffffffffe80 = systemLocale();
    ::QVariant::fromValue<QSystemLocale::CurrencyToStringArgument>(in_stack_fffffffffffffe68);
    (*in_stack_fffffffffffffe80->_vptr_QSystemLocale[2])
              (local_88,in_stack_fffffffffffffe80,0x20,local_a8);
    ::QVariant::toString(in_stack_fffffffffffffe58);
    ::QVariant::~QVariant(&in_stack_fffffffffffffe60->value);
    ::QVariant::~QVariant(&in_stack_fffffffffffffe60->value);
    bVar1 = QString::isEmpty((QString *)0x4da4bf);
    if (!bVar1) {
      in_stack_fffffffffffffeb0 = CONCAT13(1,(int3)in_stack_fffffffffffffeb0);
    }
    uVar4 = (uint)!bVar1;
    if ((in_stack_fffffffffffffeb0 & 0x1000000) == 0) {
      QString::~QString((QString *)0x4da56c);
    }
    QSystemLocale::CurrencyToStringArgument::~CurrencyToStringArgument(in_stack_fffffffffffffe60);
    if (uVar4 != 0) goto LAB_004da78b;
    in_stack_fffffffffffffeac = CurrencyIsoCode;
  }
  table = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  toString((QLocale *)in_stack_fffffffffffffe88,(qulonglong)in_stack_fffffffffffffe80);
  uVar2 = QString::isNull((QString *)0x4da5ff);
  if ((bool)uVar2) {
    currencySymbol((QLocale *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffeac);
  }
  else {
    QString::QString((QString *)in_stack_fffffffffffffe60,(QString *)in_stack_fffffffffffffe58);
  }
  bVar1 = QString::isEmpty((QString *)0x4da649);
  if (bVar1) {
    currencySymbol((QLocale *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffeac);
    QString::operator=((QString *)in_stack_fffffffffffffe60,(QString *)in_stack_fffffffffffffe58);
    QString::~QString((QString *)0x4da687);
  }
  pQVar3 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4da6c1);
  QLocaleData::currencyFormat(pQVar3->m_data);
  QLocaleData::DataRange::getData((DataRange *)CONCAT17(uVar2,in_stack_fffffffffffffe78),table);
  QString::arg<QString&,QString&>
            (in_stack_fffffffffffffe88,(QString *)in_stack_fffffffffffffe80,
             (QString *)CONCAT17(uVar2,in_stack_fffffffffffffe78));
  QString::~QString((QString *)0x4da72c);
  QString::~QString((QString *)0x4da741);
  QString::~QString((QString *)0x4da74e);
LAB_004da78b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QLocale::toCurrencyString(qulonglong value, const QString &symbol) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QSystemLocale::CurrencyToStringArgument arg(value, symbol);
        auto res = systemLocale()->query(QSystemLocale::CurrencyToString,
                                         QVariant::fromValue(arg)).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    QString str = toString(value);
    QString sym = symbol.isNull() ? currencySymbol() : symbol;
    if (sym.isEmpty())
        sym = currencySymbol(CurrencyIsoCode);
    return d->m_data->currencyFormat().getData(currency_format_data).arg(str, sym);
}